

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scanner.cc
# Opt level: O2

void __thiscall re2c::Scanner::fill(Scanner *this,uint32_t need)

{
  char **ppcVar1;
  char *pcVar2;
  uint uVar3;
  opt_t *poVar4;
  char *__dest;
  long lVar5;
  size_t sVar6;
  char *pcVar7;
  
  if ((this->super_ScannerState).eof == (char *)0x0) {
    poVar4 = realopt_t::operator->((realopt_t *)&DAT_00166888);
    if (poVar4->rFlag == false) {
      pcVar7 = (this->super_ScannerState).tok;
      pcVar2 = (this->super_ScannerState).bot;
      lVar5 = (long)pcVar7 - (long)pcVar2;
      if (0 < lVar5) {
        memmove(pcVar2,pcVar7,(long)(this->super_ScannerState).top - (long)pcVar7);
        (this->super_ScannerState).tok = (this->super_ScannerState).tok + -lVar5;
        ppcVar1 = &(this->super_ScannerState).ptr;
        *ppcVar1 = *ppcVar1 + -lVar5;
        ppcVar1 = &(this->super_ScannerState).cur;
        *ppcVar1 = *ppcVar1 + -lVar5;
        ppcVar1 = &(this->super_ScannerState).pos;
        *ppcVar1 = *ppcVar1 + -lVar5;
        ppcVar1 = &(this->super_ScannerState).lim;
        *ppcVar1 = *ppcVar1 + -lVar5;
        ppcVar1 = &(this->super_ScannerState).ctx;
        *ppcVar1 = *ppcVar1 + -lVar5;
      }
    }
    uVar3 = 0x2000;
    if (0x2000 < need) {
      uVar3 = need;
    }
    pcVar7 = (this->super_ScannerState).lim;
    if ((uint)(*(int *)&(this->super_ScannerState).top - (int)pcVar7) < uVar3) {
      pcVar2 = (this->super_ScannerState).bot;
      sVar6 = (long)pcVar7 - (long)pcVar2;
      __dest = (char *)operator_new__(sVar6 + uVar3);
      memcpy(__dest,pcVar2,sVar6);
      (this->super_ScannerState).tok =
           __dest + ((long)(this->super_ScannerState).tok - (long)pcVar2);
      (this->super_ScannerState).ptr =
           __dest + ((long)(this->super_ScannerState).ptr - (long)pcVar2);
      (this->super_ScannerState).cur =
           __dest + ((long)(this->super_ScannerState).cur - (long)pcVar2);
      (this->super_ScannerState).pos =
           __dest + ((long)(this->super_ScannerState).pos - (long)pcVar2);
      pcVar7 = __dest + sVar6;
      (this->super_ScannerState).lim = pcVar7;
      (this->super_ScannerState).top = pcVar7 + uVar3;
      (this->super_ScannerState).ctx =
           __dest + ((long)(this->super_ScannerState).ctx - (long)pcVar2);
      if (pcVar2 != (char *)0x0) {
        operator_delete__(pcVar2);
        pcVar7 = (this->super_ScannerState).lim;
      }
      (this->super_ScannerState).bot = __dest;
    }
    sVar6 = fread(pcVar7,1,(ulong)uVar3,(FILE *)this->in->file);
    if (sVar6 != uVar3) {
      pcVar7 = (this->super_ScannerState).lim;
      (this->super_ScannerState).eof = pcVar7 + sVar6 + 1;
      pcVar7[sVar6] = '\0';
    }
    ppcVar1 = &(this->super_ScannerState).lim;
    *ppcVar1 = *ppcVar1 + sVar6;
    return;
  }
  return;
}

Assistant:

void Scanner::fill (uint32_t need)
{
	if(!eof)
	{
		/* Do not get rid of anything when rFlag is active. Otherwise
		 * get rid of everything that was already handedout. */
		if (!opts->rFlag)
		{
			const ptrdiff_t diff = tok - bot;
			if (diff > 0)
			{
				const size_t move = static_cast<size_t> (top - tok);
				memmove (bot, tok, move);
				tok -= diff;
				ptr -= diff;
				cur -= diff;
				pos -= diff;
				lim -= diff;
				ctx -= diff;
			}
		}
		/* In crease buffer size. */
		if (BSIZE > need)
		{
			need = BSIZE;
		}
		if (static_cast<uint32_t> (top - lim) < need)
		{
			const size_t copy = static_cast<size_t> (lim - bot);
			char * buf = new char[copy + need];
			if (!buf)
			{
				fatal("Out of memory");
			}
			memcpy (buf, bot, copy);
			tok = &buf[tok - bot];
			ptr = &buf[ptr - bot];
			cur = &buf[cur - bot];
			pos = &buf[pos - bot];
			lim = &buf[lim - bot];
			top = &lim[need];
			ctx = &buf[ctx - bot];
			delete [] bot;
			bot = buf;
		}
		/* Append to buffer. */
		const size_t have = fread (lim, 1, need, in.file);
		if (have != need)
		{
			eof = &lim[have];
			*eof++ = '\0';
		}
		lim += have;
	}
}